

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall CTestGen9Resource_TestMSAA_Test::TestBody(CTestGen9Resource_TestMSAA_Test *this)

{
  _Tuple_impl<5UL,_int> _Var1;
  TEST_TILE_TYPE Tile;
  bool bVar2;
  pointer ptVar3;
  GMM_RESOURCE_FORMAT GVar4;
  undefined1 auVar5 [8];
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  long lVar6;
  long lVar7;
  uint32_t ExpectedValue;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong ExpectedValue_00;
  TEST_MSAA MSAA;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  pointer ptVar15;
  double dVar16;
  double dVar17;
  long lVar18;
  undefined1 auStack_148 [8];
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_108;
  ulong local_80;
  uint32_t local_74;
  uint local_70;
  uint32_t ExpectedMCSBpp;
  ulong local_68;
  double local_60;
  pointer local_58;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t MCSHAlign;
  uint32_t MCSVAlign;
  uint32_t VAlign;
  uint32_t TileDimY;
  uint32_t local_38;
  uint32_t HAlign;
  uint32_t TileDimX;
  
  TileDimY = 0;
  MCSHAlign = 0;
  local_38 = 0;
  MCSVAlign = 0;
  local_50 = 0;
  local_4c = 0;
  auStack_148 = (undefined1  [8])0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)auStack_148,4,2,false);
  ptVar3 = List.
           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar5 = auStack_148;
  do {
    if (auVar5 == (undefined1  [8])ptVar3) {
      std::
      _Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
      ::~_Vector_base((_Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                       *)auStack_148);
      return;
    }
    _Var1.super__Head_base<5UL,_int,_false>._M_head_impl =
         (((pointer)auVar5)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
         super__Tuple_impl<4UL,_int,_int>.super__Tuple_impl<5UL,_int>.
         super__Head_base<5UL,_int,_false>;
    lVar6 = (long)(((pointer)auVar5)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                  super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                  super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>
                  .super__Tuple_impl<4UL,_int,_int>.super__Head_base<4UL,_int,_false>._M_head_impl;
    HAlign._3_1_ = (((pointer)auVar5)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                   super__Tuple_impl<2UL,_int,_bool,_int,_int>.
                   super__Tuple_impl<3UL,_bool,_int,_int>.super__Head_base<3UL,_bool,_false>.
                   _M_head_impl;
    uVar10 = (((pointer)auVar5)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Head_base<1UL,_int,_false>.
             _M_head_impl;
    local_68 = (ulong)uVar10;
    Tile = (((pointer)auVar5)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
           super__Head_base<0UL,_int,_false>._M_head_impl;
    ExpectedMCSBpp = 0xfffff000;
    if (Tile == TEST_TILEYS) {
      ExpectedMCSBpp = 0xffff0000;
    }
    local_108.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_108.MultiTileArch._0_1_ = 0;
    local_108.MultiTileArch.GpuVaMappingSet = '\0';
    local_108.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_108.MultiTileArch.LocalMemPreferredSet = '\0';
    local_108.MultiTileArch.Reserved = 0;
    local_108.ExistingSysMemSize = 0;
    local_108.MaximumRenamingListLength = 0;
    local_108.NoGfxMemory = '\0';
    local_108._109_3_ = 0;
    local_108.RotateInfo = 0;
    local_108._84_4_ = 0;
    local_108.pExistingSysMem = 0;
    local_108.MaxLod = 0;
    local_108.ArraySize = 0;
    local_108.BaseAlignment = 0;
    local_108.OverridePitch = 0;
    local_108.field_6.BaseWidth64 = 0;
    local_108.BaseHeight = 0;
    local_108.Depth = 0;
    local_108.MSAA.NumSamples = 0;
    local_108.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_108.CpTag = 0;
    local_108._44_4_ = 0;
    local_108.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_108.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_108.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_108.Type = RESOURCE_INVALID;
    local_108.Format = GMM_FORMAT_INVALID;
    local_108.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    VAlign = Tile;
    if (((int)Tile < 4 &&
         (((pointer)auVar5)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
         == 1) &&
       ((uVar14 = 0x800000, (HAlign._3_1_ & 1) != 0 ||
        (uVar14 = 0x40, uVar10 - 1 < 2 && Tile != TEST_TILEX)))) {
      CTestResource::SetTileFlag((CTestResource *)this,&local_108,Tile);
      uVar8 = local_68;
      local_108.Type = RESOURCE_2D;
      local_108.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_108.Flags.Gpu & 0xffffffffff7fffbf | uVar14);
      local_108.ArraySize =
           *(uint32_t *)
            (&DAT_0018a8b0 + (long)(int)_Var1.super__Head_base<5UL,_int,_false>._M_head_impl * 4);
      local_108.NoGfxMemory = '\x01';
      GVar4 = CTestResource::SetResourceFormat((CTestResource *)this,(TEST_BPP)local_68);
      local_108.Format = GVar4;
      local_60 = (double)(uVar8 & 0xffffffff);
      local_80 = 0xfff;
      if (Tile == TEST_TILEYS) {
        local_80 = 0xffff;
      }
      uVar14 = ~local_80;
      local_70 = HAlign._3_1_ & 1;
      for (ptVar15 = (pointer)0x1; MSAA = (TEST_MSAA)ptVar15, MSAA != (MSAA_16x|MSAA_2x);
          ptVar15 = (pointer)(ulong)((int)ptVar15 + 1)) {
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  ((CTestResource *)this,(TEST_BPP)local_68,SUB41(local_70,0),VAlign,MSAA,&local_38,
                   &MCSVAlign,&TileDimY,&MCSHAlign,&local_74,&local_50,&local_4c);
        local_108.field_6.BaseWidth = local_38 * *(int *)(&DAT_0018a890 + lVar6 * 8) + 1;
        local_108.field_6.BaseWidth64._4_4_ = 0;
        local_108.Depth = 1;
        local_108.BaseHeight = MCSVAlign * *(int *)(&DAT_0018a894 + lVar6 * 8) + 1;
        dVar16 = exp2((double)(int)MSAA);
        local_108.MSAA.NumSamples = (uint32_t)(long)dVar16;
        local_108.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu & 0xffffffffffff7fff);
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,&local_108);
        if (ResourceInfo == (GMM_RESOURCE_INFO *)0x0) goto LAB_0015d956;
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo,TileDimY);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,ResourceInfo,MCSHAlign);
        List.
        super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ptVar15;
        if ((HAlign._3_1_ & 1) != 0) {
          uVar10 = (TileDimY - 1) + local_108.field_6.BaseWidth;
          uVar12 = -TileDimY;
          dVar16 = exp2(local_60);
          iVar9 = (int)(long)dVar16 * (uVar12 & uVar10) + local_38;
          uVar10 = (TileDimY - 1) + local_108.field_6.BaseWidth;
          uVar12 = -TileDimY;
          dVar16 = exp2(local_60);
          ExpectedValue =
               ~((int)(long)dVar16 * (uVar12 & uVar10) + -1 + local_38 & local_38 - 1) + iVar9;
          CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,ExpectedValue)
          ;
          if (VAlign != 0) {
            CTestResource::VerifyResourcePitchInTiles<true>
                      ((CTestResource *)this,ResourceInfo,ExpectedValue / local_38);
          }
          uVar10 = -MCSHAlign & (local_108.BaseHeight - 1) + MCSHAlign;
          if (1 < local_108.ArraySize) {
            CTestResource::VerifyResourceQPitch<true>
                      ((CTestResource *)this,ResourceInfo,(ulong)uVar10);
          }
          CTestResource::VerifyResourceSize<true>
                    ((CTestResource *)this,ResourceInfo,
                     (ulong)((-MCSVAlign &
                             (MCSVAlign - 1) +
                             uVar10 * local_108.MSAA.NumSamples * local_108.ArraySize) *
                             ExpectedValue + (int)local_80 & ExpectedMCSBpp));
          goto LAB_0015d867;
        }
        local_58 = ptVar15;
        switch(MSAA) {
        case MSAA_2x:
          bVar2 = false;
          goto LAB_0015d732;
        case MSAA_4x:
          bVar2 = true;
LAB_0015d732:
          lVar18 = 2;
          break;
        case MSAA_8x:
          bVar2 = true;
          lVar18 = 4;
          local_58 = (pointer)0x2;
          break;
        case MSAA_16x:
          bVar2 = true;
          lVar18 = 4;
          break;
        default:
          bVar2 = false;
          local_58 = (pointer)0x1;
          lVar18 = 1;
          goto LAB_0015d74b;
        }
        local_108.field_6.BaseWidth64 = local_108.field_6.BaseWidth64 + 1 & 0xfffffffffffffffe;
LAB_0015d74b:
        uVar10 = local_108.BaseHeight + 1 & 0xfffffffe;
        if (!bVar2) {
          uVar10 = local_108.BaseHeight;
        }
        local_108.BaseHeight = uVar10;
        lVar7 = local_108.field_6.BaseWidth64 * lVar18;
        uVar10 = TileDimY - 1;
        dVar16 = exp2(local_60);
        uVar12 = local_38 - 1;
        iVar11 = (int)lVar18 * local_108.field_6.BaseWidth;
        iVar9 = TileDimY - 1;
        uVar13 = -TileDimY;
        dVar17 = exp2(local_60);
        uVar8 = ((ulong)uVar12 +
                ((long)dVar16 & 0xffffffffU) * (~(ulong)uVar10 & lVar7 + (ulong)uVar10)) -
                (ulong)((int)(long)dVar17 * (uVar13 & iVar9 + iVar11) + -1 + local_38 & local_38 - 1
                       );
        CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,(uint32_t)uVar8)
        ;
        if (VAlign != 0) {
          CTestResource::VerifyResourcePitchInTiles<true>
                    ((CTestResource *)this,ResourceInfo,
                     (uint32_t)((uVar8 & 0xffffffff) / (ulong)local_38));
        }
        ExpectedValue_00 =
             (ulong)(-MCSHAlign & (MCSHAlign - 1) + (int)local_58 * local_108.BaseHeight);
        if (1 < local_108.ArraySize) {
          CTestResource::VerifyResourceQPitch<true>
                    ((CTestResource *)this,ResourceInfo,ExpectedValue_00);
        }
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)this,ResourceInfo,
                   (uVar8 & 0xffffffff) *
                   (~(ulong)(MCSVAlign - 1) &
                   local_108.ArraySize * ExpectedValue_00 + (ulong)(MCSVAlign - 1)) + local_80 &
                   uVar14);
LAB_0015d867:
        local_108.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu | 0x8000);
        ResourceInfo_00 =
             (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_108);
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo_00,local_50);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,ResourceInfo_00,local_4c);
        uVar12 = (-local_50 & (local_50 - 1) + local_108.field_6.BaseWidth) * local_74 + 0x7f;
        uVar10 = uVar12 & 0xffffff80;
        CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo_00,uVar10);
        CTestResource::VerifyResourcePitchInTiles<true>
                  ((CTestResource *)this,ResourceInfo_00,uVar12 >> 7);
        uVar12 = -local_4c & (local_108.BaseHeight - 1) + local_4c;
        if (1 < local_108.ArraySize) {
          CTestResource::VerifyResourceQPitch<true>
                    ((CTestResource *)this,ResourceInfo_00,(ulong)uVar12);
        }
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)this,ResourceInfo_00,
                   (ulong)((local_108.ArraySize * uVar12 + 0x1f & 0xffffffe0) * uVar10));
        ptVar15 = List.
                  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo_00);
LAB_0015d956:
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
      }
    }
    auVar5 = (undefined1  [8])((long)auVar5 + 0x18);
  } while( true );
}

Assistant:

TEST_F(CTestGen9Resource, TestMSAA)
{
    //Tile dimensions in Bytes
    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen9: MSAA 16x no MCS for width > 8K
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //  MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[4][2] = {
    //Input dimensions in #Tiles
    {15, 20}, //16 Tiles x 20 <Max Width: Depth MSS crosses Pitch limit beyond this>
    {0, 0},   //1x1x1
    {1, 0},   //2 Tilesx1
    {1, 1},   //2 Tiles x 2
    };

    uint32_t TestArraySize[2] = {1, 5};

    uint32_t HAlign = 0, VAlign = 0, TileDimX = 0, TileDimY = 0;
    uint32_t MCSHAlign = 0, MCSVAlign = 0, TileSize = 0;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, ArraySize
    auto Size = BuildInputIterator(List, 4, 2, false);             // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling >= TEST_TILEYF         //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k <= MSAA_16x; k++)
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64     = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight      = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
            gmmParams.Depth           = 0x1;
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                    if(gmmParams.ArraySize > 1) //Gen9: Qpitch is distance between array slices (not sample slices)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX);
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);
                    }

                    uint64_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint64_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign);
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); // Align in texels, tehn multiply w/ Bpt
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign);
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4))); //MCS Tile is TileY

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all Input types

    //Mip-mapped, MSAA case:
}